

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

ON_2dex __thiscall
ON_NurbsSurface::ControlPointSpans(ON_NurbsSurface *this,int dir,int control_point_index)

{
  ON_2dex OVar1;
  ON_2dex local_10;
  
  if ((uint)dir < 2) {
    OVar1 = ON_BsplineControlPointSpans
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],control_point_index);
    return OVar1;
  }
  ON_2dex::ON_2dex(&local_10,0,0);
  return local_10;
}

Assistant:

const ON_2dex ON_NurbsSurface::ControlPointSpans(int dir, int control_point_index) const
{
  if (0 == dir || 1 == dir)
    return ON_BsplineControlPointSpans(
      this->m_order[dir],
      this->m_cv_count[dir],
      control_point_index
    );
  return ON_2dex(0, 0);
}